

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O2

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int i;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Mat local_78;
  
  iVar6 = bottom_blob->dims;
  if (iVar6 == 3) {
    iVar6 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    uVar13 = bottom_blob->c;
    Mat::create(top_blob,iVar6,iVar1,uVar13,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar15 = iVar1 * iVar6;
    if (this->bias_data_size == 0) {
      uVar8 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        uVar8 = 0;
      }
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
        Mat::channel(&local_78,bottom_blob,uVar15);
        pvVar2 = local_78.data;
        Mat::~Mat(&local_78);
        Mat::channel(&local_78,top_blob,uVar15);
        pvVar3 = local_78.data;
        Mat::~Mat(&local_78);
        uVar9 = (ulong)uVar15;
        if (this->scale_in_data_size == 1) {
          uVar9 = 0;
        }
        fVar19 = *(float *)((long)(this->scale_in_data).data + uVar9 * 4);
        uVar9 = (ulong)uVar15;
        if (this->scale_out_data_size == 1) {
          uVar9 = 0;
        }
        fVar17 = *(float *)((long)(this->scale_out_data).data + uVar9 * 4);
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          fVar16 = activation_ss((float)*(int *)((long)pvVar2 + uVar9 * 4) * fVar19,
                                 this->activation_type,&this->activation_params);
          fVar16 = roundf(fVar16 * fVar17);
          iVar6 = (int)fVar16;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar3 + uVar9) = (char)iVar6;
        }
      }
    }
    else {
      uVar8 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        uVar8 = 0;
      }
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
        uVar12 = (ulong)uVar15;
        Mat::channel(&local_78,bottom_blob,uVar15);
        pvVar2 = local_78.data;
        Mat::~Mat(&local_78);
        Mat::channel(&local_78,top_blob,uVar15);
        pvVar3 = local_78.data;
        Mat::~Mat(&local_78);
        uVar9 = (ulong)uVar15;
        if (this->scale_in_data_size == 1) {
          uVar9 = 0;
        }
        fVar19 = *(float *)((long)(this->scale_in_data).data + uVar9 * 4);
        if (this->scale_out_data_size == 1) {
          uVar12 = 0;
        }
        fVar17 = *(float *)((long)(this->scale_out_data).data + uVar12 * 4);
        uVar9 = (ulong)uVar15;
        if (this->bias_data_size == 1) {
          uVar9 = 0;
        }
        fVar16 = *(float *)((long)(this->bias_data).data + uVar9 * 4);
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          fVar18 = activation_ss((float)*(int *)((long)pvVar2 + uVar9 * 4) * fVar19 + fVar16,
                                 this->activation_type,&this->activation_params);
          fVar18 = roundf(fVar18 * fVar17);
          iVar6 = (int)fVar18;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar3 + uVar9) = (char)iVar6;
        }
      }
    }
  }
  else if (iVar6 == 2) {
    uVar13 = bottom_blob->w;
    uVar15 = bottom_blob->h;
    Mat::create(top_blob,uVar13,uVar15,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (this->bias_data_size == 0) {
      uVar8 = (ulong)uVar13;
      if ((int)uVar13 < 1) {
        uVar8 = 0;
      }
      uVar9 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        uVar9 = 0;
      }
      for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
        iVar6 = bottom_blob->w;
        iVar1 = top_blob->w;
        uVar14 = uVar12 & 0xffffffff;
        if (this->scale_in_data_size == 1) {
          uVar14 = 0;
        }
        fVar19 = *(float *)((long)(this->scale_in_data).data + uVar14 * 4);
        uVar14 = uVar12 & 0xffffffff;
        if (this->scale_out_data_size == 1) {
          uVar14 = 0;
        }
        fVar17 = *(float *)((long)(this->scale_out_data).data + uVar14 * 4);
        sVar4 = top_blob->elemsize;
        pvVar2 = top_blob->data;
        sVar5 = bottom_blob->elemsize;
        pvVar3 = bottom_blob->data;
        for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
          fVar16 = activation_ss((float)*(int *)((long)pvVar3 +
                                                uVar14 * 4 + sVar5 * uVar12 * (long)iVar6) * fVar19,
                                 this->activation_type,&this->activation_params);
          fVar16 = roundf(fVar16 * fVar17);
          iVar7 = (int)fVar16;
          if (iVar7 < -0x7e) {
            iVar7 = -0x7f;
          }
          if (0x7e < iVar7) {
            iVar7 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar14 + sVar4 * uVar12 * (long)iVar1) = (char)iVar7;
        }
      }
    }
    else {
      uVar8 = (ulong)uVar13;
      if ((int)uVar13 < 1) {
        uVar8 = 0;
      }
      uVar9 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        uVar9 = 0;
      }
      for (uVar12 = 0; uVar14 = 0, uVar12 != uVar9; uVar12 = uVar12 + 1) {
        iVar6 = bottom_blob->w;
        iVar1 = top_blob->w;
        uVar10 = uVar12 & 0xffffffff;
        uVar11 = uVar10;
        if (this->scale_in_data_size == 1) {
          uVar11 = uVar14;
        }
        fVar19 = *(float *)((long)(this->scale_in_data).data + uVar11 * 4);
        uVar11 = uVar10;
        if (this->scale_out_data_size == 1) {
          uVar11 = uVar14;
        }
        fVar17 = *(float *)((long)(this->scale_out_data).data + uVar11 * 4);
        if (this->bias_data_size == 1) {
          uVar10 = uVar14;
        }
        fVar16 = *(float *)((long)(this->bias_data).data + uVar10 * 4);
        sVar4 = top_blob->elemsize;
        pvVar2 = top_blob->data;
        sVar5 = bottom_blob->elemsize;
        pvVar3 = bottom_blob->data;
        for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
          fVar18 = activation_ss((float)*(int *)((long)pvVar3 +
                                                uVar14 * 4 + sVar5 * uVar12 * (long)iVar6) * fVar19
                                 + fVar16,this->activation_type,&this->activation_params);
          fVar18 = roundf(fVar18 * fVar17);
          iVar7 = (int)fVar18;
          if (iVar7 < -0x7e) {
            iVar7 = -0x7f;
          }
          if (0x7e < iVar7) {
            iVar7 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar14 + sVar4 * uVar12 * (long)iVar1) = (char)iVar7;
        }
      }
    }
  }
  else {
    if (iVar6 != 1) {
      return 0;
    }
    uVar13 = bottom_blob->w;
    Mat::create(top_blob,uVar13,1,opt->blob_allocator);
    pvVar2 = top_blob->data;
    if (pvVar2 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    pvVar3 = bottom_blob->data;
    iVar6 = this->scale_in_data_size;
    iVar1 = this->scale_out_data_size;
    if (iVar1 == 1 && iVar6 == 1) {
      fVar19 = *(this->scale_in_data).data;
      fVar17 = *(this->scale_out_data).data;
      if (this->bias_data_size == 1) {
        fVar16 = *(this->bias_data).data;
        uVar8 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar8 = 0;
        }
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          fVar18 = activation_ss((float)*(int *)((long)pvVar3 + uVar9 * 4) * fVar19 + fVar16,
                                 this->activation_type,&this->activation_params);
          fVar18 = roundf(fVar18 * fVar17);
          iVar6 = (int)fVar18;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar9) = (char)iVar6;
        }
      }
      else if (this->bias_data_size == 0) {
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
          fVar16 = activation_ss((float)*(int *)((long)pvVar3 + uVar8 * 4) * fVar19,
                                 this->activation_type,&this->activation_params);
          fVar16 = roundf(fVar16 * fVar17);
          iVar6 = (int)fVar16;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar8) = (char)iVar6;
        }
      }
      else {
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
          fVar16 = activation_ss((float)*(int *)((long)pvVar3 + uVar8 * 4) * fVar19 +
                                 *(float *)((long)(this->bias_data).data + uVar8 * 4),
                                 this->activation_type,&this->activation_params);
          fVar16 = roundf(fVar16 * fVar17);
          iVar6 = (int)fVar16;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar8) = (char)iVar6;
        }
      }
    }
    else if (iVar1 < 2 || iVar6 != 1) {
      if (iVar6 < 2 || iVar1 != 1) {
        if (this->bias_data_size == 1) {
          fVar19 = *(this->bias_data).data;
          uVar8 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar8 = 0;
          }
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            fVar17 = activation_ss((float)*(int *)((long)pvVar3 + uVar9 * 4) *
                                   *(float *)((long)(this->scale_in_data).data + uVar9 * 4) + fVar19
                                   ,this->activation_type,&this->activation_params);
            fVar17 = roundf(fVar17 * *(float *)((long)(this->scale_out_data).data + uVar9 * 4));
            iVar6 = (int)fVar17;
            if (iVar6 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            *(char *)((long)pvVar2 + uVar9) = (char)iVar6;
          }
        }
        else if (this->bias_data_size == 0) {
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
            fVar19 = activation_ss((float)*(int *)((long)pvVar3 + uVar8 * 4) *
                                   *(float *)((long)(this->scale_in_data).data + uVar8 * 4),
                                   this->activation_type,&this->activation_params);
            fVar19 = roundf(fVar19 * *(float *)((long)(this->scale_out_data).data + uVar8 * 4));
            iVar6 = (int)fVar19;
            if (iVar6 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            *(char *)((long)pvVar2 + uVar8) = (char)iVar6;
          }
        }
        else {
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
            fVar19 = activation_ss((float)*(int *)((long)pvVar3 + uVar8 * 4) *
                                   *(float *)((long)(this->scale_in_data).data + uVar8 * 4) +
                                   *(float *)((long)(this->bias_data).data + uVar8 * 4),
                                   this->activation_type,&this->activation_params);
            fVar19 = roundf(fVar19 * *(float *)((long)(this->scale_out_data).data + uVar8 * 4));
            iVar6 = (int)fVar19;
            if (iVar6 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            *(char *)((long)pvVar2 + uVar8) = (char)iVar6;
          }
        }
      }
      else {
        fVar19 = *(this->scale_out_data).data;
        if (this->bias_data_size == 1) {
          fVar17 = *(this->bias_data).data;
          uVar8 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar8 = 0;
          }
          for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            fVar16 = activation_ss((float)*(int *)((long)pvVar3 + uVar9 * 4) *
                                   *(float *)((long)(this->scale_in_data).data + uVar9 * 4) + fVar17
                                   ,this->activation_type,&this->activation_params);
            fVar16 = roundf(fVar16 * fVar19);
            iVar6 = (int)fVar16;
            if (iVar6 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            *(char *)((long)pvVar2 + uVar9) = (char)iVar6;
          }
        }
        else if (this->bias_data_size == 0) {
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
            fVar17 = activation_ss((float)*(int *)((long)pvVar3 + uVar8 * 4) *
                                   *(float *)((long)(this->scale_in_data).data + uVar8 * 4),
                                   this->activation_type,&this->activation_params);
            fVar17 = roundf(fVar17 * fVar19);
            iVar6 = (int)fVar17;
            if (iVar6 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            *(char *)((long)pvVar2 + uVar8) = (char)iVar6;
          }
        }
        else {
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
            fVar17 = activation_ss((float)*(int *)((long)pvVar3 + uVar8 * 4) *
                                   *(float *)((long)(this->scale_in_data).data + uVar8 * 4) +
                                   *(float *)((long)(this->bias_data).data + uVar8 * 4),
                                   this->activation_type,&this->activation_params);
            fVar17 = roundf(fVar17 * fVar19);
            iVar6 = (int)fVar17;
            if (iVar6 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            *(char *)((long)pvVar2 + uVar8) = (char)iVar6;
          }
        }
      }
    }
    else {
      fVar19 = *(this->scale_in_data).data;
      if (this->bias_data_size == 1) {
        fVar17 = *(this->bias_data).data;
        uVar8 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar8 = 0;
        }
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          fVar16 = activation_ss((float)*(int *)((long)pvVar3 + uVar9 * 4) * fVar19 + fVar17,
                                 this->activation_type,&this->activation_params);
          fVar16 = roundf(fVar16 * *(float *)((long)(this->scale_out_data).data + uVar9 * 4));
          iVar6 = (int)fVar16;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar9) = (char)iVar6;
        }
      }
      else if (this->bias_data_size == 0) {
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
          fVar17 = activation_ss((float)*(int *)((long)pvVar3 + uVar8 * 4) * fVar19,
                                 this->activation_type,&this->activation_params);
          fVar17 = roundf(fVar17 * *(float *)((long)(this->scale_out_data).data + uVar8 * 4));
          iVar6 = (int)fVar17;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar8) = (char)iVar6;
        }
      }
      else {
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
          fVar17 = activation_ss((float)*(int *)((long)pvVar3 + uVar8 * 4) * fVar19 +
                                 *(float *)((long)(this->bias_data).data + uVar8 * 4),
                                 this->activation_type,&this->activation_params);
          fVar17 = roundf(fVar17 * *(float *)((long)(this->scale_out_data).data + uVar8 * 4));
          iVar6 = (int)fVar17;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar8) = (char)iVar6;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        signed char* ptr = top_blob;

        if (scale_in_data_size == 1 && scale_out_data_size == 1)
        {
            const float scale_in = scale_in_data[0];
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else if (scale_in_data_size == 1 && scale_out_data_size > 1)
        {
            const float scale_in = scale_in_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
        else if (scale_in_data_size > 1 && scale_out_data_size == 1)
        {
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else // if (scale_in_data_size > 1 && scale_out_data_size > 1)
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in + bias;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    return 0;
}